

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  
  auVar12 = _DAT_00112600;
  auVar11 = _DAT_001125e0;
  uVar2 = (ulong)(len >> 4);
  if (len < 0x80) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 8;
    do {
      uVar5 = uVar3;
      auVar15 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10),auVar11,
                                  *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x10));
      auVar16 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x10),auVar12,
                                  *(undefined1 (*) [32])(array + uVar4 * 0x10));
      auVar13 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x20),auVar11,
                                  *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x30));
      auVar14 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x30),auVar12,
                                  *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x20));
      auVar7 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x40),auVar11,
                                 *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x50));
      auVar8 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x50),auVar12,
                                 *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x40));
      auVar9 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x60),auVar11,
                                 *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x70));
      auVar10 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x70),auVar12,
                                  *(undefined1 (*) [32])(array + uVar4 * 0x10 + 0x60));
      lVar6 = 0x20;
      do {
        *(int *)((long)flags + lVar6 + -4) =
             POPCOUNT((uint)(SUB321(auVar9 >> 7,0) & 1) | (uint)(SUB321(auVar9 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar9 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar9 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar9 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar9 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar9 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar9 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar9 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar9 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar9 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar9 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar9 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar9 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar9 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar9 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar9 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar9 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar9 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar9 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar9 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar9 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar9 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar9 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar9 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar9 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar9 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar9 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar9 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar9 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar9 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar9[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar7 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar7 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar13 >> 7,0) & 1) | (uint)(SUB321(auVar13 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar13 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar13 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar13 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar13 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar13 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar13 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar13 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar13 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar13 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar13 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar13 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar13 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar13 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar13 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar13 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar13 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar13 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar13 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar13 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar13 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar13 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar13 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar13 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar13 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar13 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar13 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar13 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar13 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar13 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar13[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar15 >> 7,0) & 1) | (uint)(SUB321(auVar15 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar15 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar15 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar15 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar15 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar15 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar15 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar15 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar15 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar15 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar15 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar15 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar15 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar15 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar15 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar15 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar15 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar15 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar15 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar15 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar15 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar15 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar15 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar15 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar15 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar15 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar15 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar15 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar15 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar15 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar15[0x1f] >> 7) << 0x1f) + *(int *)((long)flags + lVar6 + -4)
        ;
        *(int *)((long)flags + lVar6 + 0x1c) =
             POPCOUNT((uint)(SUB321(auVar10 >> 7,0) & 1) | (uint)(SUB321(auVar10 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar10 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar10 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar10 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar10 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar10 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar10 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar10 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar10 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar10 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar10 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar10 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar10 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar10 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar10 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar10 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar10 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar10 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar10 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar10 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar10 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar10 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar10 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar10 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar10 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar10 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar10 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar10 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar10[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar8 >> 7,0) & 1) | (uint)(SUB321(auVar8 >> 0xf,0) & 1) << 1 |
                      (uint)(SUB321(auVar8 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar8 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar8 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar8 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar8 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar8 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar8 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar8 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar8 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar8 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar8 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar8 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar8 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar8 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar8 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar8 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar8 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar8 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar8 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar8 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar8 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar8 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar8 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar8 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar8 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar8 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar8 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar8 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar8 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar8[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar14 >> 7,0) & 1) | (uint)(SUB321(auVar14 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar14 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar14 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar14 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar14 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar14 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar14 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar14 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar14 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar14 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar14 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar14 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar14 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar14 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar14 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar14 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar14 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar14 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar14 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar14 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar14 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar14 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar14 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar14 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar14 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar14 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar14 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar14 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar14 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar14 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar14[0x1f] >> 7) << 0x1f) +
             POPCOUNT((uint)(SUB321(auVar16 >> 7,0) & 1) | (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f) +
             *(int *)((long)flags + lVar6 + 0x1c);
        auVar15 = vpaddb_avx2(auVar15,auVar15);
        auVar16 = vpaddb_avx2(auVar16,auVar16);
        auVar13 = vpaddb_avx2(auVar13,auVar13);
        auVar14 = vpaddb_avx2(auVar14,auVar14);
        auVar7 = vpaddb_avx2(auVar7,auVar7);
        auVar8 = vpaddb_avx2(auVar8,auVar8);
        auVar9 = vpaddb_avx2(auVar9,auVar9);
        auVar10 = vpaddb_avx2(auVar10,auVar10);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 8;
    } while (uVar5 + 8 <= uVar2);
  }
  auVar16 = _DAT_00112600;
  auVar15 = _DAT_001125e0;
  uVar4 = uVar5 | 4;
  auVar11 = _DAT_001125e0;
  auVar12 = _DAT_00112600;
  while (uVar3 = uVar4, _DAT_001125e0 = auVar11, _DAT_00112600 = auVar12, uVar3 <= uVar2) {
    auVar11 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10),auVar15,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10));
    auVar12 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10),auVar16,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10));
    auVar13 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x20),auVar15,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x30));
    auVar14 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x30),auVar16,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x20));
    lVar6 = 0x20;
    do {
      *(int *)((long)flags + lVar6 + -4) =
           POPCOUNT((uint)(SUB321(auVar13 >> 7,0) & 1) | (uint)(SUB321(auVar13 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(auVar13 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(auVar13 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(auVar13 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(auVar13 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(auVar13 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(auVar13 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(auVar13 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(auVar13 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(auVar13 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(auVar13 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(auVar13 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(auVar13 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(auVar13 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(auVar13 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(auVar13 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(auVar13 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(auVar13 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(auVar13 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(auVar13 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(auVar13 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(auVar13 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(auVar13 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(auVar13 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(auVar13 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(auVar13 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(auVar13 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(auVar13 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(auVar13 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(auVar13 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(auVar13[0x1f] >> 7) << 0x1f) +
           POPCOUNT((uint)(SUB321(auVar11 >> 7,0) & 1) | (uint)(SUB321(auVar11 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(auVar11 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(auVar11 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(auVar11 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(auVar11 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(auVar11 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(auVar11 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(auVar11 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(auVar11 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(auVar11 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(auVar11 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(auVar11 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(auVar11 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(auVar11 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(auVar11 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(auVar11 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(auVar11 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(auVar11 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(auVar11 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(auVar11 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(auVar11 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(auVar11 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(auVar11 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(auVar11 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(auVar11 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(auVar11 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(auVar11 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(auVar11 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(auVar11 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(auVar11 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(auVar11[0x1f] >> 7) << 0x1f) + *(int *)((long)flags + lVar6 + -4);
      *(int *)((long)flags + lVar6 + 0x1c) =
           POPCOUNT((uint)(SUB321(auVar14 >> 7,0) & 1) | (uint)(SUB321(auVar14 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(auVar14 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(auVar14 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(auVar14 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(auVar14 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(auVar14 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(auVar14 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(auVar14 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(auVar14 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(auVar14 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(auVar14 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(auVar14 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(auVar14 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(auVar14 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(auVar14 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(auVar14 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(auVar14 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(auVar14 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(auVar14 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(auVar14 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(auVar14 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(auVar14 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(auVar14 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(auVar14 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(auVar14 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(auVar14 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(auVar14 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(auVar14 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(auVar14 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(auVar14 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(auVar14[0x1f] >> 7) << 0x1f) +
           POPCOUNT((uint)(SUB321(auVar12 >> 7,0) & 1) | (uint)(SUB321(auVar12 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(auVar12 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(auVar12 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(auVar12 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(auVar12 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(auVar12 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(auVar12 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(auVar12 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(auVar12 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(auVar12 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(auVar12 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(auVar12 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(auVar12 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(auVar12 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(auVar12 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(auVar12 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(auVar12 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(auVar12 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(auVar12 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(auVar12 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(auVar12 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(auVar12 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(auVar12 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(auVar12 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(auVar12 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(auVar12 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(auVar12 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(auVar12 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(auVar12 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(auVar12 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(auVar12[0x1f] >> 7) << 0x1f) + *(int *)((long)flags + lVar6 + 0x1c)
      ;
      auVar11 = vpaddb_avx2(auVar11,auVar11);
      auVar12 = vpaddb_avx2(auVar12,auVar12);
      auVar13 = vpaddb_avx2(auVar13,auVar13);
      auVar14 = vpaddb_avx2(auVar14,auVar14);
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    uVar5 = uVar3;
    auVar11 = _DAT_001125e0;
    auVar12 = _DAT_00112600;
    uVar4 = uVar3 + 4;
  }
  while (uVar4 = uVar5 + 2, uVar4 <= uVar2) {
    auVar15 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10),auVar11,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10));
    auVar16 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar5 * 0x10 + 0x10),auVar12,
                                *(undefined1 (*) [32])(array + uVar5 * 0x10));
    lVar6 = 0x20;
    do {
      piVar1 = (int *)((long)flags + lVar6 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(SUB321(auVar15 >> 7,0) & 1) |
                                   (uint)(SUB321(auVar15 >> 0xf,0) & 1) << 1 |
                                   (uint)(SUB321(auVar15 >> 0x17,0) & 1) << 2 |
                                   (uint)(SUB321(auVar15 >> 0x1f,0) & 1) << 3 |
                                   (uint)(SUB321(auVar15 >> 0x27,0) & 1) << 4 |
                                   (uint)(SUB321(auVar15 >> 0x2f,0) & 1) << 5 |
                                   (uint)(SUB321(auVar15 >> 0x37,0) & 1) << 6 |
                                   (uint)(SUB321(auVar15 >> 0x3f,0) & 1) << 7 |
                                   (uint)(SUB321(auVar15 >> 0x47,0) & 1) << 8 |
                                   (uint)(SUB321(auVar15 >> 0x4f,0) & 1) << 9 |
                                   (uint)(SUB321(auVar15 >> 0x57,0) & 1) << 10 |
                                   (uint)(SUB321(auVar15 >> 0x5f,0) & 1) << 0xb |
                                   (uint)(SUB321(auVar15 >> 0x67,0) & 1) << 0xc |
                                   (uint)(SUB321(auVar15 >> 0x6f,0) & 1) << 0xd |
                                   (uint)(SUB321(auVar15 >> 0x77,0) & 1) << 0xe |
                                   (uint)SUB321(auVar15 >> 0x7f,0) << 0xf |
                                   (uint)(SUB321(auVar15 >> 0x87,0) & 1) << 0x10 |
                                   (uint)(SUB321(auVar15 >> 0x8f,0) & 1) << 0x11 |
                                   (uint)(SUB321(auVar15 >> 0x97,0) & 1) << 0x12 |
                                   (uint)(SUB321(auVar15 >> 0x9f,0) & 1) << 0x13 |
                                   (uint)(SUB321(auVar15 >> 0xa7,0) & 1) << 0x14 |
                                   (uint)(SUB321(auVar15 >> 0xaf,0) & 1) << 0x15 |
                                   (uint)(SUB321(auVar15 >> 0xb7,0) & 1) << 0x16 |
                                   (uint)SUB321(auVar15 >> 0xbf,0) << 0x17 |
                                   (uint)(SUB321(auVar15 >> 199,0) & 1) << 0x18 |
                                   (uint)(SUB321(auVar15 >> 0xcf,0) & 1) << 0x19 |
                                   (uint)(SUB321(auVar15 >> 0xd7,0) & 1) << 0x1a |
                                   (uint)(SUB321(auVar15 >> 0xdf,0) & 1) << 0x1b |
                                   (uint)(SUB321(auVar15 >> 0xe7,0) & 1) << 0x1c |
                                   (uint)(SUB321(auVar15 >> 0xef,0) & 1) << 0x1d |
                                   (uint)(SUB321(auVar15 >> 0xf7,0) & 1) << 0x1e |
                                   (uint)(byte)(auVar15[0x1f] >> 7) << 0x1f);
      piVar1 = (int *)((long)flags + lVar6 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(SUB321(auVar16 >> 7,0) & 1) |
                                   (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1 |
                                   (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 |
                                   (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
                                   (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 |
                                   (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
                                   (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 |
                                   (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
                                   (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 |
                                   (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
                                   (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 |
                                   (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
                                   (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc |
                                   (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
                                   (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe |
                                   (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
                                   (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 |
                                   (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11 |
                                   (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
                                   (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 |
                                   (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14 |
                                   (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
                                   (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 |
                                   (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
                                   (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 |
                                   (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19 |
                                   (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
                                   (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b |
                                   (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c |
                                   (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
                                   (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e |
                                   (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f);
      auVar15 = vpaddb_avx2(auVar15,auVar15);
      auVar16 = vpaddb_avx2(auVar16,auVar16);
      lVar6 = lVar6 + -4;
      uVar5 = uVar4;
    } while (lVar6 != 0);
  }
  uVar5 = uVar5 << 4;
  if (uVar5 < len) {
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar18 = vpmovsxbd_avx512f(_DAT_00111080);
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar20 = vpbroadcastd_avx512f();
      auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
      auVar20 = vpandd_avx512f(auVar20,auVar19);
      auVar17 = vpaddd_avx512f(auVar20,auVar17);
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])flags = auVar17;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4, 5) A(6, 7)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) input##p = P0(p) P0(k)
            P(0,1) P(2, 3) P(4, 5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}